

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMultiphysicsCompMesh.cpp
# Opt level: O0

void __thiscall
TPZMultiphysicsCompMesh::BuildMultiphysicsSpaceWithMemory
          (TPZMultiphysicsCompMesh *this,TPZVec<int> *active_approx_spaces,
          TPZVec<TPZCompMesh_*> *mesh_vector)

{
  int iVar1;
  int64_t iVar2;
  int64_t iVar3;
  ostream *this_00;
  TPZCreateApproximationSpace *this_01;
  TPZCompMesh *in_RDI;
  TPZMultiphysicsElement *mfcel;
  TPZCompEl *cel;
  long el;
  int nel_res;
  int n_approx_spaces;
  TPZMultiphysicsCompMesh *in_stack_000000c0;
  TPZMultiphysicsCompMesh *in_stack_00000200;
  size_t in_stack_00000318;
  char *in_stack_00000320;
  long *in_stack_fffffffffffffef8;
  TPZMultiphysicsCompMesh *in_stack_ffffffffffffff00;
  TPZGeoMesh *this_02;
  TPZMultiphysicsCompMesh *this_03;
  TPZVec<TPZCompMesh_*> *in_stack_ffffffffffffff38;
  long lVar4;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  undefined1 local_b8 [184];
  
  this_03 = (TPZMultiphysicsCompMesh *)(local_b8 + 0x68);
  TPZManVector<int,_5>::TPZManVector
            ((TPZManVector<int,_5> *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
             (TPZVec<int> *)in_stack_ffffffffffffff38);
  TPZManVector<int,_5>::operator=((TPZManVector<int,_5> *)this_03,(TPZManVector<int,_5> *)in_RDI);
  TPZManVector<int,_5>::~TPZManVector((TPZManVector<int,_5> *)in_stack_ffffffffffffff00);
  this_02 = (TPZGeoMesh *)local_b8;
  TPZManVector<TPZCompMesh_*,_7>::TPZManVector
            ((TPZManVector<TPZCompMesh_*,_7> *)
             CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),in_stack_ffffffffffffff38
            );
  TPZManVector<TPZCompMesh_*,_7>::operator=
            ((TPZManVector<TPZCompMesh_*,_7> *)this_03,(TPZManVector<TPZCompMesh_*,_7> *)in_RDI);
  TPZManVector<TPZCompMesh_*,_7>::~TPZManVector
            ((TPZManVector<TPZCompMesh_*,_7> *)in_stack_ffffffffffffff00);
  iVar2 = TPZVec<TPZCompMesh_*>::size((TPZVec<TPZCompMesh_*> *)((long)&in_RDI[1].fName.field_2 + 8))
  ;
  iVar3 = TPZVec<int>::size((TPZVec<int> *)(in_RDI + 1));
  if (iVar2 != iVar3) {
    this_00 = std::operator<<((ostream *)&std::cout,
                              "TPZMultiphysicsCompMesh:: The vector provided should have the same size."
                             );
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    pzinternal::DebugStopImpl(in_stack_00000320,in_stack_00000318);
  }
  iVar2 = TPZVec<TPZCompMesh_*>::size((TPZVec<TPZCompMesh_*> *)((long)&in_RDI[1].fName.field_2 + 8))
  ;
  TPZCompMesh::SetNMeshes(in_RDI,(long)(int)iVar2);
  TPZCompMesh::Reference(in_RDI);
  TPZGeoMesh::ResetReference(this_02);
  TPZCompMesh::SetAllCreateFunctionsMultiphysicElemWithMem((TPZCompMesh *)0x1ab3fd6);
  this_01 = TPZCompMesh::ApproxSpace(in_RDI);
  TPZCreateApproximationSpace::CreateWithMemory(this_01,true);
  CleanElementsConnects(this_03);
  TPZCompMesh::AutoBuild((TPZCompMesh *)0x1ab4001);
  AddElements(in_stack_000000c0);
  AddConnects(in_stack_00000200);
  LoadSolutionFromMeshes(in_stack_ffffffffffffff00);
  iVar2 = TPZCompMesh::NElements((TPZCompMesh *)0x1ab4029);
  iVar1 = (int)iVar2;
  for (lVar4 = 0; lVar4 < iVar1; lVar4 = lVar4 + 1) {
    in_stack_ffffffffffffff00 =
         (TPZMultiphysicsCompMesh *)
         TPZCompMesh::Element
                   (&in_stack_ffffffffffffff00->super_TPZCompMesh,(int64_t)in_stack_fffffffffffffef8
                   );
    if (in_stack_ffffffffffffff00 == (TPZMultiphysicsCompMesh *)0x0) {
      in_stack_fffffffffffffef8 = (long *)0x0;
    }
    else {
      in_stack_fffffffffffffef8 =
           (long *)__dynamic_cast(in_stack_ffffffffffffff00,&TPZCompEl::typeinfo,
                                  &TPZMultiphysicsElement::typeinfo,0);
    }
    if (in_stack_fffffffffffffef8 != (long *)0x0) {
      (**(code **)(*in_stack_fffffffffffffef8 + 0x168))();
    }
  }
  return;
}

Assistant:

void TPZMultiphysicsCompMesh::BuildMultiphysicsSpaceWithMemory(TPZVec<int> & active_approx_spaces, TPZVec<TPZCompMesh * > & mesh_vector){
    m_active_approx_spaces = active_approx_spaces;
    m_mesh_vector          = mesh_vector;
    if (m_mesh_vector.size() != m_active_approx_spaces.size()) {
        std::cout<< "TPZMultiphysicsCompMesh:: The vector provided should have the same size." << std::endl;
        DebugStop();
    }
    
    int n_approx_spaces = m_mesh_vector.size();
    
    SetNMeshes(n_approx_spaces);
    Reference()->ResetReference();
    SetAllCreateFunctionsMultiphysicElemWithMem();
    ApproxSpace().CreateWithMemory(true);
    // delete all elements and connects in the mesh
    CleanElementsConnects();
    TPZCompMesh::AutoBuild();
    AddElements();
    AddConnects();
    LoadSolutionFromMeshes();
    
    int nel_res = NElements();
    for (long el = 0; el < nel_res; el++) {
        TPZCompEl *cel = Element(el);
        TPZMultiphysicsElement *mfcel = dynamic_cast<TPZMultiphysicsElement *>(cel);
        if (!mfcel) {
            continue;
        }
        mfcel->PrepareIntPtIndices();
    }
    
}